

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copyteximage2d_invalid_border
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_VALUE is generated if border is not 0.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_TEXTURE_2D target",&local_69);
  NegativeTestContext::beginSection(pNVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0xde1,0,0x1907,0,0,0,0,-1);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0xde1,0,0x1907,0,0,0,0,1);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GL_TEXTURE_CUBE_MAP_POSITIVE_X target",&local_91);
  NegativeTestContext::beginSection(pNVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8515,0,0x1907,0,0,0,0,-1);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8515,0,0x1907,0,0,0,0,1);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"GL_TEXTURE_CUBE_MAP_POSITIVE_Y target",&local_b9);
  NegativeTestContext::beginSection(pNVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8517,0,0x1907,0,0,0,0,-1);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8517,0,0x1907,0,0,0,0,1);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"GL_TEXTURE_2D target",&local_e1);
  NegativeTestContext::beginSection(pNVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8519,0,0x1907,0,0,0,0,-1);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8519,0,0x1907,0,0,0,0,1);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"GL_TEXTURE_CUBE_MAP_NEGATIVE_X target",&local_109);
  NegativeTestContext::beginSection(pNVar1,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8516,0,0x1907,0,0,0,0,-1);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8516,0,0x1907,0,0,0,0,1);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target",&local_131);
  NegativeTestContext::beginSection(pNVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8518,0,0x1907,0,0,0,0,-1);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x8518,0,0x1907,0,0,0,0,1);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target",&local_159);
  NegativeTestContext::beginSection(pNVar1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x851a,0,0x1907,0,0,0,0,-1);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&local_10->super_CallLogWrapper,0x851a,0,0x1907,0,0,0,0,1);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void copyteximage2d_invalid_border (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if border is not 0.");

	ctx.beginSection("GL_TEXTURE_2D target");
	ctx.glCopyTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 0, 0, 0, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 0, 0, 0, 0, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_X target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, 0, 0, 0, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, 0, 0, 0, 0, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Y target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, 0, 0, 0, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, 0, 0, 0, 0, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_2D target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, 0, 0, 0, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, 0, 0, 0, 0, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_X target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, 0, 0, 0, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, 0, 0, 0, 0, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, 0, 0, 0, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, 0, 0, 0, 0, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, 0, 0, 0, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, 0, 0, 0, 0, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.endSection();
}